

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

void __thiscall fmp4_stream::emsg::parse(emsg *this,char *ptr,uint data_size)

{
  long lVar1;
  pointer *ppuVar2;
  char cVar3;
  ulong uVar4;
  size_type sVar5;
  iterator __position;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  allocator local_51;
  string local_50;
  undefined7 uStack_4f;
  undefined1 local_40 [16];
  
  box::parse((box *)this,ptr);
  uVar8 = (ulong)((uint)(this->super_full_box).super_box.has_uuid_ * 0x10 +
                 (uint)(this->super_full_box).super_box.is_large_ * 8);
  lVar1 = uVar8 + 8;
  uVar6 = *(uint *)(ptr + uVar8 + 8);
  (this->super_full_box).magic_conf_ =
       uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  cVar3 = ptr[uVar8 + 8];
  (this->super_full_box).super_box.field_0x62 = cVar3;
  uVar6 = *(uint *)(ptr + uVar8 + 8);
  *(uint *)&(this->super_full_box).super_box.field_0x64 =
       uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8;
  if (cVar3 == '\0') {
    std::__cxx11::string::string(&local_50,ptr + uVar8 + 0xc,&local_51);
    std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,&local_50);
    if ((undefined1 *)CONCAT71(uStack_4f,local_50) != local_40) {
      operator_delete((undefined1 *)CONCAT71(uStack_4f,local_50));
    }
    sVar5 = (this->scheme_id_uri_)._M_string_length;
    lVar7 = sVar5 + lVar1 + 5;
    std::__cxx11::string::string(&local_50,ptr + sVar5 + lVar1 + 5,&local_51);
    std::__cxx11::string::operator=((string *)&this->value_,&local_50);
    if ((undefined1 *)CONCAT71(uStack_4f,local_50) != local_40) {
      operator_delete((undefined1 *)CONCAT71(uStack_4f,local_50));
    }
    sVar5 = (this->value_)._M_string_length;
    lVar1 = sVar5 + lVar7;
    uVar6 = *(uint *)(ptr + lVar1 + 1);
    this->timescale_ =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar6 = *(uint *)(ptr + lVar1 + 5);
    this->presentation_time_delta_ =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar6 = *(uint *)(ptr + lVar1 + 9);
    this->event_duration_ =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar6 = *(uint *)(ptr + lVar1 + 0xd);
    this->id_ = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar6 = (int)sVar5 + (int)lVar7 + 0x11;
  }
  else {
    uVar6 = *(uint *)(ptr + uVar8 + 0xc);
    this->timescale_ =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar4 = *(ulong *)(ptr + uVar8 + 0x10);
    this->presentation_time_ =
         uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
         (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
         (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    uVar6 = *(uint *)(ptr + uVar8 + 0x18);
    this->event_duration_ =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar6 = *(uint *)(ptr + uVar8 + 0x1c);
    this->id_ = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    std::__cxx11::string::string(&local_50,ptr + uVar8 + 0x20,&local_51);
    std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,&local_50);
    if ((undefined1 *)CONCAT71(uStack_4f,local_50) != local_40) {
      operator_delete((undefined1 *)CONCAT71(uStack_4f,local_50));
    }
    sVar5 = (this->scheme_id_uri_)._M_string_length;
    std::__cxx11::string::string(&local_50,ptr + lVar1 + sVar5 + 0x19,&local_51);
    std::__cxx11::string::operator=((string *)&this->value_,&local_50);
    if ((undefined1 *)CONCAT71(uStack_4f,local_50) != local_40) {
      operator_delete((undefined1 *)CONCAT71(uStack_4f,local_50));
    }
    uVar6 = (int)(this->value_)._M_string_length + (int)lVar1 + (int)sVar5 + 0x1a;
  }
  if (uVar6 < data_size) {
    uVar8 = (ulong)uVar6;
    do {
      local_50 = *(string *)(ptr + uVar8);
      __position._M_current =
           (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (&this->message_data_,__position,(uchar *)&local_50);
      }
      else {
        *__position._M_current = (uchar)local_50;
        ppuVar2 = &(this->message_data_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar2 = *ppuVar2 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (data_size != uVar8);
  }
  return;
}

Assistant:

void emsg::parse(const char *ptr, unsigned int data_size)
	{
		full_box::parse(ptr);
		uint64_t offset = full_box::size();
		if (version_ == 0)
		{
			scheme_id_uri_ = std::string(ptr + offset);
			//cout << "scheme_id_uri: " << scheme_id_uri << endl;
			offset = offset + scheme_id_uri_.size() + 1;
			value_ = std::string(ptr + offset);
			//cout << "value: " << value << endl;
			offset = offset + value_.size() + 1;
			timescale_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
			//cout << "timescale: " << timescale << endl;
			presentation_time_delta_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
			//cout << "presentation_time_delta: " << presentation_time_delta << endl;
			event_duration_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
			//cout << "event_duration: " << event_duration << endl;
			id_ = fmp4_read_uint32(ptr + offset);
			//cout << "id: " << id << endl;
			offset += 4;
		}
		else
		{
			timescale_ = fmp4_read_uint32(ptr + offset);
			//cout << "timescale: " << timescale << endl;
			offset += 4;
			presentation_time_ = fmp4_read_uint64(ptr + offset);
			//cout << "presentation time: " << presentation_time << endl;
			offset += 8;
			event_duration_ = fmp4_read_uint32(ptr + offset);
			//cout << "event duration: " << event_duration << endl;
			offset += 4;
			id_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
			//cout << "id: " << id << endl;
			scheme_id_uri_ = std::string(ptr + offset);
			offset = offset + scheme_id_uri_.size() + 1;
			//cout << "scheme_id_uri: " << scheme_id_uri << endl;
			value_ = std::string(ptr + offset);
			//cout << "value: " << value << endl;
			offset = offset + value_.size() + 1;
		}
		for (unsigned int i = (unsigned int)offset; i < data_size; i++)
		{
			message_data_.push_back(*(ptr + (size_t)i));
		}
	}